

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  int iVar8;
  int iVar9;
  U32 UVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  U32 UVar14;
  U32 UVar15;
  U32 UVar16;
  U32 UVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  size_t sVar24;
  size_t sVar25;
  long lVar26;
  U64 UVar27;
  U64 UVar28;
  BYTE *pBVar29;
  ulong uVar30;
  bool bVar31;
  BYTE *local_aa0;
  BYTE *local_a90;
  BYTE *local_a40;
  BYTE *local_a28;
  BYTE *local_a10;
  BYTE *local_a00;
  BYTE *local_9e0;
  BYTE *local_9d0;
  BYTE *local_9c8;
  BYTE *local_9c0;
  uint local_9b8;
  uint local_9b4;
  uint local_84c;
  uint local_848;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *lowMatchPtr_2;
  BYTE *matchEnd_2;
  BYTE *lowMatchPtr_1;
  BYTE *matchEnd_1;
  BYTE *pBStack_7f0;
  U32 offset_4;
  BYTE *match3;
  BYTE *match3Base;
  U32 matchIndex3;
  size_t h3;
  U32 offset_3;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd_1;
  size_t mLength_1;
  BYTE *repMatch_1;
  BYTE *repBase;
  U32 repIndex_1;
  U32 current_1;
  BYTE *matchLong_1;
  BYTE *matchLongBase;
  U32 matchLongIndex;
  size_t hLong;
  BYTE *match_1;
  BYTE *matchBase;
  U32 matchIndex;
  size_t hSmall;
  U32 offset_2;
  U32 offset_1;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_630;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_5e0;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 current;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_598;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_530;
  U32 offsetSaved;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 maxDistance;
  U32 lowestValid;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_4;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_6;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_5;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_3;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_2;
  ptrdiff_t diff;
  
  pUVar4 = ms->hashTable;
  UVar1 = (ms->cParams).hashLog;
  pUVar5 = ms->chainTable;
  UVar2 = (ms->cParams).chainLog;
  pBVar18 = (BYTE *)((long)src + srcSize);
  pBVar19 = pBVar18 + -8;
  pBVar6 = (ms->window).base;
  iVar9 = (int)pBVar6;
  iVar8 = (int)src;
  UVar10 = ZSTD_getLowestMatchIndex(ms,(iVar8 - iVar9) + (int)srcSize,(ms->cParams).windowLog);
  uVar12 = (ms->window).dictLimit;
  local_848 = UVar10;
  if (UVar10 < uVar12) {
    local_848 = uVar12;
  }
  pBVar20 = pBVar6 + local_848;
  pBVar23 = (ms->window).dictBase;
  pBVar21 = pBVar23 + UVar10;
  pBVar22 = pBVar23 + local_848;
  hSmall._4_4_ = *rep;
  hSmall._0_4_ = rep[1];
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  if (local_848 == UVar10) {
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar9 = (int)pBVar6;
    iVar11 = (iVar8 - iVar9) + (int)srcSize;
    local_84c = (ms->window).dictLimit;
    uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    if (uVar12 < iVar11 - local_84c) {
      local_84c = iVar11 - uVar12;
    }
    pBVar18 = pBVar6 + local_84c;
    pBVar19 = (BYTE *)((long)src + srcSize);
    pBVar23 = pBVar19 + -8;
    uVar12 = *rep;
    uVar3 = rep[1];
    dms._4_4_ = 0;
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar8 == (int)pBVar18));
    uVar13 = (int)anchor_1 - (int)pBVar18;
    local_530 = uVar3;
    if (uVar13 < uVar3) {
      local_530 = 0;
      dms._4_4_ = uVar3;
    }
    offsetSaved = uVar12;
    _lowestValid = (BYTE *)src;
    if (uVar13 < uVar12) {
      offsetSaved = 0;
      dms._4_4_ = uVar12;
    }
    while (anchor_1 < pBVar23) {
      sVar24 = ZSTD_hashPtr(anchor_1,UVar1,8);
      sVar25 = ZSTD_hashPtr(anchor_1,UVar2,mls);
      ZSTD_hashPtr(anchor_1,UVar1,8);
      ZSTD_hashPtr(anchor_1,UVar2,mls);
      iVar8 = (int)anchor_1;
      UVar10 = iVar8 - iVar9;
      uVar12 = pUVar4[sVar24];
      uVar3 = pUVar5[sVar25];
      match = pBVar6 + uVar12;
      pBStack_5e0 = pBVar6 + uVar3;
      pUVar5[sVar25] = UVar10;
      pUVar4[sVar24] = UVar10;
      UVar15 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved));
      UVar14 = MEM_read32(anchor_1 + 1);
      if (offsetSaved == 0 || UVar15 != UVar14) {
        if (local_84c < uVar12) {
          UVar27 = MEM_read64(match);
          UVar28 = MEM_read64(anchor_1);
          if (UVar27 != UVar28) goto LAB_001b69c4;
          sVar24 = ZSTD_count(anchor_1 + 8,match + 8,pBVar19);
          lStack_598 = sVar24 + 8;
          h2._4_4_ = iVar8 - (int)match;
          while( true ) {
            bVar31 = false;
            if (_lowestValid < anchor_1 && pBVar18 < match) {
              bVar31 = anchor_1[-1] == match[-1];
            }
            if (!bVar31) break;
            anchor_1 = anchor_1 + -1;
            match = match + -1;
            lStack_598 = lStack_598 + 1;
          }
LAB_001b705e:
          local_530 = offsetSaved;
          offsetSaved = h2._4_4_;
          uVar30 = (long)anchor_1 - (long)_lowestValid;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar30) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar19 < _lowestValid + uVar30) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar19 + -0x20 < _lowestValid + uVar30) {
            ZSTD_safecopyLiterals(seqStore->lit,_lowestValid,_lowestValid + uVar30,pBVar19 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowestValid);
            if (0x10 < uVar30) {
              pBVar20 = seqStore->lit;
              pBVar21 = pBVar20 + 0x10;
              lVar26 = (long)pBVar21 - (long)(_lowestValid + 0x10);
              if (lVar26 < 8 && -0x10 < lVar26) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar26 < 0x10 && -0x10 < lVar26) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar21,_lowestValid + 0x10);
              while (pBVar20 = pBVar20 + 0x20, pBVar20 < pBVar21 + (uVar30 - 0x10)) {
                op_2 = _lowestValid + 0x20;
                ZSTD_copy16(pBVar20,op_2);
                ZSTD_copy16(pBVar20 + 0x10,_lowestValid + 0x30);
                _lowestValid = op_2;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar30;
          seqStore->sequences->offset = h2._4_4_ + 3;
          if (0xffff < lStack_598 - 3U) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_598 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_001b762f;
        }
LAB_001b69c4:
        if (local_84c < uVar3) {
          UVar15 = MEM_read32(pBStack_5e0);
          UVar14 = MEM_read32(anchor_1);
          if (UVar15 == UVar14) {
            sVar24 = ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            uVar12 = pUVar4[sVar24];
            pBStack_630 = pBVar6 + uVar12;
            pUVar4[sVar24] = UVar10 + 1;
            if (local_84c < uVar12) {
              UVar27 = MEM_read64(pBStack_630);
              UVar28 = MEM_read64(anchor_1 + 1);
              if (UVar27 == UVar28) {
                sVar24 = ZSTD_count(anchor_1 + 9,pBStack_630 + 8,pBVar19);
                lStack_598 = sVar24 + 8;
                anchor_1 = anchor_1 + 1;
                h2._4_4_ = (int)anchor_1 - (int)pBStack_630;
                while( true ) {
                  bVar31 = false;
                  if (_lowestValid < anchor_1 && pBVar18 < pBStack_630) {
                    bVar31 = anchor_1[-1] == pBStack_630[-1];
                  }
                  if (!bVar31) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_630 = pBStack_630 + -1;
                  lStack_598 = lStack_598 + 1;
                }
                goto LAB_001b705e;
              }
            }
            sVar24 = ZSTD_count(anchor_1 + 4,pBStack_5e0 + 4,pBVar19);
            lStack_598 = sVar24 + 4;
            h2._4_4_ = iVar8 - (int)pBStack_5e0;
            while( true ) {
              bVar31 = false;
              if (_lowestValid < anchor_1 && pBVar18 < pBStack_5e0) {
                bVar31 = anchor_1[-1] == pBStack_5e0[-1];
              }
              if (!bVar31) break;
              anchor_1 = anchor_1 + -1;
              pBStack_5e0 = pBStack_5e0 + -1;
              lStack_598 = lStack_598 + 1;
            }
            goto LAB_001b705e;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_lowestValid >> 8) + 1;
      }
      else {
        sVar24 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved),pBVar19);
        lStack_598 = sVar24 + 4;
        anchor_1 = anchor_1 + 1;
        uVar30 = (long)anchor_1 - (long)_lowestValid;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar30) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar19 < _lowestValid + uVar30) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar19 + -0x20 < _lowestValid + uVar30) {
          ZSTD_safecopyLiterals(seqStore->lit,_lowestValid,_lowestValid + uVar30,pBVar19 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid);
          if (0x10 < uVar30) {
            pBVar20 = seqStore->lit;
            pBVar21 = pBVar20 + 0x10;
            lVar26 = (long)pBVar21 - (long)(_lowestValid + 0x10);
            if (lVar26 < 8 && -0x10 < lVar26) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar26 < 0x10 && -0x10 < lVar26) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar21,_lowestValid + 0x10);
            while (pBVar20 = pBVar20 + 0x20, pBVar20 < pBVar21 + (uVar30 - 0x10)) {
              op_1 = _lowestValid + 0x20;
              ZSTD_copy16(pBVar20,op_1);
              ZSTD_copy16(pBVar20 + 0x10,_lowestValid + 0x30);
              _lowestValid = op_1;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar30;
        if (0xffff < uVar30) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar30;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_001b762f:
        _lowestValid = anchor_1 + lStack_598;
        anchor_1 = _lowestValid;
        if (_lowestValid <= pBVar23) {
          uVar12 = UVar10 + 2;
          sVar24 = ZSTD_hashPtr(pBVar6 + uVar12,UVar1,8);
          pUVar4[sVar24] = uVar12;
          sVar24 = ZSTD_hashPtr(_lowestValid + -2,UVar1,8);
          pUVar4[sVar24] = ((int)_lowestValid + -2) - iVar9;
          sVar24 = ZSTD_hashPtr(pBVar6 + uVar12,UVar2,mls);
          pUVar5[sVar24] = uVar12;
          sVar24 = ZSTD_hashPtr(_lowestValid + -1,UVar2,mls);
          pUVar5[sVar24] = ((int)_lowestValid + -1) - iVar9;
          while( true ) {
            uVar12 = local_530;
            bVar31 = false;
            if (anchor_1 <= pBVar23) {
              UVar10 = MEM_read32(anchor_1);
              UVar15 = MEM_read32(anchor_1 + -(ulong)local_530);
              bVar31 = local_530 != 0 && UVar10 == UVar15;
            }
            _lowestValid = anchor_1;
            if (!bVar31) break;
            sVar24 = ZSTD_count(anchor_1 + 4,anchor_1 + (4 - (ulong)local_530),pBVar19);
            local_530 = offsetSaved;
            offsetSaved = uVar12;
            sVar25 = ZSTD_hashPtr(anchor_1,UVar2,mls);
            pUVar5[sVar25] = (int)anchor_1 - iVar9;
            sVar25 = ZSTD_hashPtr(anchor_1,UVar1,8);
            pUVar4[sVar25] = (int)anchor_1 - iVar9;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar19 < anchor_1) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar19 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar19 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar24 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar24 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_1 = anchor_1 + sVar24 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_9b4 = dms._4_4_;
    }
    else {
      local_9b4 = offsetSaved;
    }
    *rep = local_9b4;
    if (local_530 == 0) {
      local_9b8 = dms._4_4_;
    }
    else {
      local_9b8 = local_530;
    }
    rep[1] = local_9b8;
    ms_local = (ZSTD_matchState_t *)(pBVar19 + -(long)_lowestValid);
  }
  else {
LAB_001b87a7:
    UVar15 = hSmall._4_4_;
    if (anchor < pBVar19) {
      sVar24 = ZSTD_hashPtr(anchor,UVar2,mls);
      uVar12 = pUVar5[sVar24];
      local_9c0 = pBVar6;
      if (uVar12 < local_848) {
        local_9c0 = pBVar23;
      }
      hLong = (size_t)(local_9c0 + uVar12);
      sVar25 = ZSTD_hashPtr(anchor,UVar1,8);
      uVar3 = pUVar4[sVar25];
      local_9c8 = pBVar6;
      if (uVar3 < local_848) {
        local_9c8 = pBVar23;
      }
      _repIndex_1 = local_9c8 + uVar3;
      UVar14 = (int)anchor - iVar9;
      uVar13 = (UVar14 + 1) - hSmall._4_4_;
      local_9d0 = pBVar6;
      if (uVar13 < local_848) {
        local_9d0 = pBVar23;
      }
      pUVar4[sVar25] = UVar14;
      pUVar5[sVar24] = UVar14;
      if ((local_848 - 1) - uVar13 < 3 || uVar13 <= UVar10) {
LAB_001b901d:
        if (UVar10 < uVar3) {
          UVar27 = MEM_read64(_repIndex_1);
          UVar28 = MEM_read64(anchor);
          if (UVar27 != UVar28) goto LAB_001b979b;
          local_a00 = pBVar20;
          pBVar7 = pBVar18;
          if (uVar3 < local_848) {
            local_a00 = pBVar21;
            pBVar7 = pBVar22;
          }
          sVar24 = ZSTD_count_2segments(anchor + 8,_repIndex_1 + 8,pBVar18,pBVar7,pBVar20);
          repMatchEnd_1 = (BYTE *)(sVar24 + 8);
          hSmall._4_4_ = UVar14 - uVar3;
          while( true ) {
            bVar31 = false;
            if (iend < anchor && local_a00 < _repIndex_1) {
              bVar31 = anchor[-1] == _repIndex_1[-1];
            }
            if (!bVar31) break;
            anchor = anchor + -1;
            _repIndex_1 = _repIndex_1 + -1;
            repMatchEnd_1 = repMatchEnd_1 + 1;
          }
          uVar30 = (long)anchor - (long)iend;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar30) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar18 < iend + uVar30) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar18 + -0x20 < iend + uVar30) {
            ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar30,pBVar18 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,iend);
            if (0x10 < uVar30) {
              pBVar7 = seqStore->lit;
              pBVar29 = pBVar7 + 0x10;
              lVar26 = (long)pBVar29 - (long)(iend + 0x10);
              if (lVar26 < 8 && -0x10 < lVar26) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar26 < 0x10 && -0x10 < lVar26) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar29,iend + 0x10);
              while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar29 + (uVar30 - 0x10)) {
                op_6 = iend + 0x20;
                ZSTD_copy16(pBVar7,op_6);
                ZSTD_copy16(pBVar7 + 0x10,iend + 0x30);
                iend = op_6;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar30;
          seqStore->sequences->offset = hSmall._4_4_ + 3;
          if ((BYTE *)0xffff < repMatchEnd_1 + -3) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(repMatchEnd_1 + -3);
          seqStore->sequences = seqStore->sequences + 1;
LAB_001ba1ac:
          hSmall._0_4_ = UVar15;
          goto LAB_001ba1ae;
        }
LAB_001b979b:
        if (UVar10 < uVar12) {
          UVar16 = MEM_read32((void *)hLong);
          UVar17 = MEM_read32(anchor);
          if (UVar16 == UVar17) {
            sVar24 = ZSTD_hashPtr(anchor + 1,UVar1,8);
            uVar3 = pUVar4[sVar24];
            local_a10 = pBVar6;
            if (uVar3 < local_848) {
              local_a10 = pBVar23;
            }
            pBStack_7f0 = local_a10 + uVar3;
            pUVar4[sVar24] = UVar14 + 1;
            if (UVar10 < uVar3) {
              UVar27 = MEM_read64(pBStack_7f0);
              UVar28 = MEM_read64(anchor + 1);
              if (UVar27 != UVar28) goto LAB_001b9a45;
              local_a28 = pBVar20;
              pBVar7 = pBVar18;
              if (uVar3 < local_848) {
                local_a28 = pBVar21;
                pBVar7 = pBVar22;
              }
              sVar24 = ZSTD_count_2segments(anchor + 9,pBStack_7f0 + 8,pBVar18,pBVar7,pBVar20);
              repMatchEnd_1 = (BYTE *)(sVar24 + 8);
              anchor = anchor + 1;
              matchEnd_1._4_4_ = (UVar14 + 1) - uVar3;
              while( true ) {
                bVar31 = false;
                if (iend < anchor && local_a28 < pBStack_7f0) {
                  bVar31 = anchor[-1] == pBStack_7f0[-1];
                }
                if (!bVar31) break;
                anchor = anchor + -1;
                pBStack_7f0 = pBStack_7f0 + -1;
                repMatchEnd_1 = repMatchEnd_1 + 1;
              }
            }
            else {
LAB_001b9a45:
              local_a40 = pBVar20;
              pBVar7 = pBVar18;
              if (uVar12 < local_848) {
                local_a40 = pBVar21;
                pBVar7 = pBVar22;
              }
              sVar24 = ZSTD_count_2segments(anchor + 4,(BYTE *)(hLong + 4),pBVar18,pBVar7,pBVar20);
              repMatchEnd_1 = (BYTE *)(sVar24 + 4);
              matchEnd_1._4_4_ = UVar14 - uVar12;
              while( true ) {
                bVar31 = false;
                if (iend < anchor && local_a40 < hLong) {
                  bVar31 = anchor[-1] == *(BYTE *)(hLong - 1);
                }
                if (!bVar31) break;
                anchor = anchor + -1;
                hLong = hLong - 1;
                repMatchEnd_1 = repMatchEnd_1 + 1;
              }
            }
            hSmall._4_4_ = matchEnd_1._4_4_;
            uVar30 = (long)anchor - (long)iend;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar30) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 < iend + uVar30) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 + -0x20 < iend + uVar30) {
              ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar30,pBVar18 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,iend);
              if (0x10 < uVar30) {
                pBVar7 = seqStore->lit;
                pBVar29 = pBVar7 + 0x10;
                lVar26 = (long)pBVar29 - (long)(iend + 0x10);
                if (lVar26 < 8 && -0x10 < lVar26) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar26 < 0x10 && -0x10 < lVar26) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar29,iend + 0x10);
                while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar29 + (uVar30 - 0x10)) {
                  op_7 = iend + 0x20;
                  ZSTD_copy16(pBVar7,op_7);
                  ZSTD_copy16(pBVar7 + 0x10,iend + 0x30);
                  iend = op_7;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar30;
            if (0xffff < uVar30) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar30;
            seqStore->sequences->offset = matchEnd_1._4_4_ + 3;
            if ((BYTE *)0xffff < repMatchEnd_1 + -3) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(repMatchEnd_1 + -3);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_001ba1ac;
          }
        }
        anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
      }
      else {
        UVar16 = MEM_read32(local_9d0 + uVar13);
        UVar17 = MEM_read32(anchor + 1);
        if (UVar16 != UVar17) goto LAB_001b901d;
        local_9e0 = pBVar18;
        if (uVar13 < local_848) {
          local_9e0 = pBVar22;
        }
        sVar24 = ZSTD_count_2segments(anchor + 5,local_9d0 + uVar13 + 4,pBVar18,local_9e0,pBVar20);
        repMatchEnd_1 = (BYTE *)(sVar24 + 4);
        anchor = anchor + 1;
        uVar30 = (long)anchor - (long)iend;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar30) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar18 < iend + uVar30) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar18 + -0x20 < iend + uVar30) {
          ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar30,pBVar18 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,iend);
          if (0x10 < uVar30) {
            pBVar7 = seqStore->lit;
            pBVar29 = pBVar7 + 0x10;
            lVar26 = (long)pBVar29 - (long)(iend + 0x10);
            if (lVar26 < 8 && -0x10 < lVar26) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar26 < 0x10 && -0x10 < lVar26) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar29,iend + 0x10);
            while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar29 + (uVar30 - 0x10)) {
              op_5 = iend + 0x20;
              ZSTD_copy16(pBVar7,op_5);
              ZSTD_copy16(pBVar7 + 0x10,iend + 0x30);
              iend = op_5;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar30;
        if (0xffff < uVar30) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar30;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar24 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar24 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_001ba1ae:
        iend = repMatchEnd_1 + (long)anchor;
        anchor = iend;
        if (iend <= pBVar19) {
          uVar12 = UVar14 + 2;
          sVar24 = ZSTD_hashPtr(pBVar6 + uVar12,UVar1,8);
          pUVar4[sVar24] = uVar12;
          sVar24 = ZSTD_hashPtr(iend + -2,UVar1,8);
          pUVar4[sVar24] = ((int)iend + -2) - iVar9;
          sVar24 = ZSTD_hashPtr(pBVar6 + uVar12,UVar2,mls);
          pUVar5[sVar24] = uVar12;
          sVar24 = ZSTD_hashPtr(iend + -1,UVar2,mls);
          pUVar5[sVar24] = ((int)iend + -1) - iVar9;
          for (; UVar15 = (U32)hSmall, iend = anchor, anchor <= pBVar19;
              anchor = anchor + sVar24 + 4) {
            UVar14 = (int)anchor - iVar9;
            uVar12 = UVar14 - (U32)hSmall;
            if (uVar12 < local_848) {
              local_a90 = pBVar23 + uVar12;
            }
            else {
              local_a90 = pBVar6 + uVar12;
            }
            if ((local_848 - 1) - uVar12 < 3 || uVar12 <= UVar10) break;
            UVar16 = MEM_read32(local_a90);
            UVar17 = MEM_read32(anchor);
            if (UVar16 != UVar17) break;
            local_aa0 = pBVar18;
            if (uVar12 < local_848) {
              local_aa0 = pBVar22;
            }
            sVar24 = ZSTD_count_2segments(anchor + 4,local_a90 + 4,pBVar18,local_aa0,pBVar20);
            hSmall._0_4_ = hSmall._4_4_;
            hSmall._4_4_ = UVar15;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar18 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar18 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar24 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar24 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar25 = ZSTD_hashPtr(anchor,UVar2,mls);
            pUVar5[sVar25] = UVar14;
            sVar25 = ZSTD_hashPtr(anchor,UVar1,8);
            pUVar4[sVar25] = UVar14;
          }
        }
      }
      goto LAB_001b87a7;
    }
    *rep = hSmall._4_4_;
    rep[1] = (U32)hSmall;
    ms_local = (ZSTD_matchState_t *)(pBVar18 + -(long)iend);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = current+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}